

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O0

void prmon::snip_string_and_test
               (char *env_string,uint start,uint pos,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *disabled_monitors)

{
  bool bVar1;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  string monitor_name;
  string local_70 [55];
  allocator local_39;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  
  __x = (value_type *)(in_RDI + (ulong)in_ESI);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(ulong)(in_EDX - in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(char *)__x,(ulong)this,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_70,local_38);
  bVar1 = valid_monitor_disable(in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_70);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,__x);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void snip_string_and_test(char *env_string, unsigned start, unsigned pos,
                          std::vector<std::string> &disabled_monitors) {
  std::string monitor_name(env_string + start, pos - start);
  if (valid_monitor_disable(monitor_name))
    disabled_monitors.push_back(monitor_name);
}